

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::BeginWrite3dmDimStyleTable(ON_BinaryArchive *this)

{
  char *sFormat;
  int line_number;
  
  if (this->m_archive_dim_style_table_status == 0) {
    if (this->m_3dm_previous_table < text_style_table) {
      this->m_archive_dim_style_table_status = 1;
      return true;
    }
    sFormat = "archive contains text style information. This is incorrect.";
    line_number = 0x29ea;
  }
  else {
    sFormat = "BeginWrite3dmDimStyleTable() called at the wrong time.";
    line_number = 0x29e2;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_BinaryArchive::BeginWrite3dmDimStyleTable()
{
  // August 2016. text style information is now on ON_DimStyle
  // A text style table must still be saved in archives so earlier versions of Rhino
  // can read the archives written by new versions.
  // 
  if (0 != m_archive_dim_style_table_status)
  {
    ON_ERROR("BeginWrite3dmDimStyleTable() called at the wrong time.");
    return false;
  }

  const unsigned int previous_table_index = static_cast<unsigned int>(Previous3dmTable());
  const unsigned int text_style_table_index = static_cast<unsigned int>(ON_3dmArchiveTableType::text_style_table);
  if (previous_table_index >= text_style_table_index)
  {
    ON_ERROR("archive contains text style information. This is incorrect.");
    return false;
  }

  m_archive_dim_style_table_status = 1;
  return true;
}